

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::increase_elimination_bound(Internal *this)

{
  bool bVar1;
  iterator lit;
  int *piVar2;
  Flags *pFVar3;
  Range *in_RDI;
  int idx;
  iterator __end1;
  iterator __begin1;
  Range *__range1;
  int in_stack_000004e8;
  char in_stack_000004ef;
  Internal *in_stack_000004f0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  iterator local_18;
  Internal *this_00;
  
  if ((long)in_RDI[0x171].n < (long)*(int *)((long)&in_RDI[0x1a8].n + 4)) {
    if ((long)in_RDI[0x171].n < 0) {
      in_RDI[0x171].n = (int *)0x0;
    }
    else if (in_RDI[0x171].n == (int *)0x0) {
      in_RDI[0x171].n = (int *)0x1;
    }
    else {
      in_RDI[0x171].n = (int *)((long)in_RDI[0x171].n << 1);
    }
    if ((long)*(int *)((long)&in_RDI[0x1a8].n + 4) < (long)in_RDI[0x171].n) {
      in_RDI[0x171].n = (int *)(long)*(int *)((long)&in_RDI[0x1a8].n + 4);
    }
    if (in_RDI[0x38a].n != (int *)0x0) {
      phase((Internal *)in_RDI[0x38a].n,"elim-phase",(int64_t)in_RDI[0x263].n,
            "new elimination bound %ld",in_RDI[0x171].n);
    }
    this_00 = (Internal *)(in_RDI + 0x38d);
    lit = Range::begin(in_RDI);
    local_18 = Range::end(in_RDI);
    while (bVar1 = CaDiCaL::operator!=((iterator *)&stack0xffffffffffffffec,&local_18), bVar1) {
      piVar2 = Range::iterator::operator*((iterator *)&stack0xffffffffffffffec);
      iVar4 = *piVar2;
      bVar1 = active((Internal *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
      if ((bVar1) &&
         (pFVar3 = flags((Internal *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20)), ((uint)*pFVar3 >> 8 & 1) == 0)) {
        mark_elim(this_00,lit.idx);
      }
      Range::iterator::operator++((iterator *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
    }
    report(in_stack_000004f0,in_stack_000004ef,in_stack_000004e8);
  }
  return;
}

Assistant:

void Internal::increase_elimination_bound () {

  if (lim.elimbound >= opts.elimboundmax)
    return;

  if (lim.elimbound < 0)
    lim.elimbound = 0;
  else if (!lim.elimbound)
    lim.elimbound = 1;
  else
    lim.elimbound *= 2;

  if (lim.elimbound > opts.elimboundmax)
    lim.elimbound = opts.elimboundmax;

  PHASE ("elim-phase", stats.elimphases,
         "new elimination bound %" PRId64 "", lim.elimbound);

  // Now reschedule all active variables for elimination again.
  //
#ifdef LOGGING
  int count = 0;
#endif
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (flags (idx).elim)
      continue;
    mark_elim (idx);
#ifdef LOGGING
    count++;
#endif
  }
  LOG ("marked %d variables as elimination candidates", count);

  report ('^');
}